

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O1

int FmsIODestroyFmsIODataCollectionInfo(FmsIODataCollectionInfo *dc_info)

{
  FmsInt FVar1;
  void *pvVar2;
  FmsIODomainInfo *pFVar3;
  FmsIODomainNameInfo *__ptr;
  FmsIOComponentInfo *pFVar4;
  FmsIOComponentPartInfo *pFVar5;
  FmsIOTagInfo *pFVar6;
  FmsInt *__ptr_00;
  FmsIOFieldInfo *pFVar7;
  FmsIOMetaDataInfo *minfo;
  int in_EAX;
  int extraout_EAX;
  FmsInt FVar8;
  FmsInt FVar9;
  FmsInt FVar10;
  FmsInt FVar11;
  long lVar12;
  long lVar13;
  
  if (dc_info != (FmsIODataCollectionInfo *)0x0) {
    FVar11 = dc_info->mesh_info->ndomain_names;
    if (FVar11 != 0) {
      FVar8 = 0;
      do {
        FVar1 = dc_info->mesh_info->domain_names[FVar8].ndomains;
        if (FVar1 != 0) {
          FVar10 = 0;
          do {
            pFVar3 = dc_info->mesh_info->domain_names[FVar8].domains + FVar10;
            FVar9 = pFVar3->dim;
            if (FVar9 != 0) {
              lVar12 = 0x20;
              do {
                pvVar2 = *(void **)((long)&pFVar3->entities->ent_type + lVar12);
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
                lVar12 = lVar12 + 0x28;
                FVar9 = FVar9 - 1;
              } while (FVar9 != 0);
            }
            if (pFVar3->entities != (FmsIOEntityInfo *)0x0) {
              free(pFVar3->entities);
            }
            FVar10 = FVar10 + 1;
          } while (FVar10 != FVar1);
        }
        pFVar3 = dc_info->mesh_info->domain_names[FVar8].domains;
        if (pFVar3 != (FmsIODomainInfo *)0x0) {
          free(pFVar3);
        }
        FVar8 = FVar8 + 1;
      } while (FVar8 != FVar11);
      __ptr = dc_info->mesh_info->domain_names;
      if (__ptr != (FmsIODomainNameInfo *)0x0) {
        free(__ptr);
      }
    }
    FVar11 = dc_info->mesh_info->ncomponents;
    if (FVar11 != 0) {
      FVar8 = 0;
      do {
        pFVar4 = dc_info->mesh_info->components;
        FVar1 = pFVar4[FVar8].nparts;
        if (FVar1 != 0) {
          lVar12 = 0;
          FVar10 = 0;
          do {
            pFVar5 = pFVar4[FVar8].parts;
            lVar13 = 0x40;
            do {
              if ((*(long *)((long)pFVar5->entities + lVar13 + lVar12 + -0x38) != 0) &&
                 (pvVar2 = *(void **)((long)pFVar5->entities + lVar13 + lVar12 + -0x20),
                 pvVar2 != (void *)0x0)) {
                free(pvVar2);
              }
              lVar13 = lVar13 + 0x28;
            } while (lVar13 != 0x180);
            FVar10 = FVar10 + 1;
            lVar12 = lVar12 + 0x160;
          } while (FVar10 != FVar1);
        }
        if (pFVar4[FVar8].parts != (FmsIOComponentPartInfo *)0x0) {
          free(pFVar4[FVar8].parts);
        }
        if ((pFVar4[FVar8].relation_size != 0) && (pFVar4[FVar8].relation_values != (FmsInt *)0x0))
        {
          free(pFVar4[FVar8].relation_values);
        }
        FVar8 = FVar8 + 1;
      } while (FVar8 != FVar11);
      pFVar4 = dc_info->mesh_info->components;
      if (pFVar4 != (FmsIOComponentInfo *)0x0) {
        free(pFVar4);
      }
    }
    FVar11 = dc_info->mesh_info->ntags;
    if (FVar11 != 0) {
      lVar12 = 0x38;
      do {
        pFVar6 = dc_info->mesh_info->tags;
        pvVar2 = *(void **)((long)pFVar6 + lVar12 + -0x20);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        pvVar2 = *(void **)((long)pFVar6 + lVar12 + -8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        pvVar2 = *(void **)((long)&pFVar6->name + lVar12);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        lVar12 = lVar12 + 0x40;
        FVar11 = FVar11 - 1;
      } while (FVar11 != 0);
      pFVar6 = dc_info->mesh_info->tags;
      if (pFVar6 != (FmsIOTagInfo *)0x0) {
        free(pFVar6);
      }
    }
    __ptr_00 = dc_info->mesh_info->partition_info;
    if (__ptr_00 != (FmsInt *)0x0) {
      free(__ptr_00);
    }
    if (dc_info->mesh_info != (FmsIOMeshInfo *)0x0) {
      free(dc_info->mesh_info);
    }
    FVar11 = dc_info->nfds;
    if (FVar11 != 0) {
      lVar12 = 0x18;
      do {
        pvVar2 = *(void **)((long)&dc_info->fds->name + lVar12);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        lVar12 = lVar12 + 0x28;
        FVar11 = FVar11 - 1;
      } while (FVar11 != 0);
      if (dc_info->fds != (FmsIOFieldDescriptorInfo *)0x0) {
        free(dc_info->fds);
      }
    }
    FVar11 = dc_info->nfields;
    if (FVar11 != 0) {
      lVar12 = 0x38;
      do {
        pFVar7 = dc_info->fields;
        pvVar2 = *(void **)((long)pFVar7 + lVar12 + -8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        minfo = *(FmsIOMetaDataInfo **)((long)&pFVar7->name + lVar12);
        if (minfo != (FmsIOMetaDataInfo *)0x0) {
          FmsIODestroyFmsIOMetaDataInfo(minfo);
          pvVar2 = *(void **)((long)&pFVar7->name + lVar12);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        lVar12 = lVar12 + 0x40;
        FVar11 = FVar11 - 1;
      } while (FVar11 != 0);
      if (dc_info->fields != (FmsIOFieldInfo *)0x0) {
        free(dc_info->fields);
      }
    }
    if (dc_info->md != (FmsIOMetaDataInfo *)0x0) {
      FmsIODestroyFmsIOMetaDataInfo(dc_info->md);
      if (dc_info->md != (FmsIOMetaDataInfo *)0x0) {
        free(dc_info->md);
      }
    }
    free(dc_info);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int
FmsIODestroyFmsIODataCollectionInfo(FmsIODataCollectionInfo *dc_info) {
  if(!dc_info) E_RETURN(1);

  // Destroy DomainNameInfos & DomainInfos
  const FmsInt ndomnames = dc_info->mesh_info->ndomain_names;
  if(ndomnames) {
    FmsInt i;
    for(i = 0; i < ndomnames; i++) {
      FmsInt j;
      FmsInt ndoms = dc_info->mesh_info->domain_names[i].ndomains;
      for(j = 0; j < ndoms; j++) {
        FmsInt k = 0;
        FmsIODomainInfo *dinfo = &dc_info->mesh_info->domain_names[i].domains[j];
        const FmsInt dim = dinfo->dim;
        for(k = 0; k < dim; k++) {
          FmsIOEntityInfo *einfo = &dinfo->entities[k];
          FREE(einfo->values);
          // FREE(einfo); // It's a 1-D array
        }
        FREE(dinfo->entities);
      }
      FREE(dc_info->mesh_info->domain_names[i].domains);
    }
    FREE(dc_info->mesh_info->domain_names);
  }

  // Destroy ComponentInfos
  const FmsInt ncomponents = dc_info->mesh_info->ncomponents;
  if(ncomponents) {
    FmsInt i;
    for(i = 0; i < ncomponents; i++) {
      FmsIOComponentInfo *comp_info = &dc_info->mesh_info->components[i];
      const FmsInt nparts = comp_info->nparts;
      FmsInt j;
      for(j = 0; j < nparts; j++) {
        FmsIOComponentPartInfo *pinfo = &comp_info->parts[j];
        FmsInt k;
        for(k = 0; k < FMS_NUM_ENTITY_TYPES; k++) {
          if(pinfo->entities[k].nents)
            FREE(pinfo->entities[k].values);
        }
      }
      FREE(comp_info->parts);
      // Add the component relations
      const FmsInt nrelations = comp_info->relation_size;
      if(nrelations) {
        FREE(comp_info->relation_values);
      }
    }
    FREE(dc_info->mesh_info->components);
  }

  // Destroy TagInfos
  const FmsInt ntags = dc_info->mesh_info->ntags;
  if(ntags) {
    FmsInt i;
    for(i = 0; i < ntags; i++) {
      FmsIOTagInfo *tinfo = &dc_info->mesh_info->tags[i];
      FREE(tinfo->values);
      FREE(tinfo->tag_values);
      FREE(tinfo->descriptions);
    }
    FREE(dc_info->mesh_info->tags);
  }

  FREE(dc_info->mesh_info->partition_info);
  FREE(dc_info->mesh_info);

  // Add FieldDescriptors
  const FmsInt nfds = dc_info->nfds;
  if(nfds) {
    FmsInt i;
    for(i = 0; i < nfds; i++) {
      FmsIOFieldDescriptorInfo *fd_info = &dc_info->fds[i];
      FREE(fd_info->fixed_order);
    }
    FREE(dc_info->fds);
  }

  const FmsInt nfields = dc_info->nfields;
  if(nfields) {
    FmsInt i;
    for(i = 0; i < nfields; i++) {
      FmsIOFieldInfo *finfo = &dc_info->fields[i];
      FREE(finfo->data);
      if(finfo->md) {
        FmsIODestroyFmsIOMetaDataInfo(finfo->md);
        FREE(finfo->md);
      }
    }
    FREE(dc_info->fields);
  }

  // If we have MetaData destroy it
  if(dc_info->md) {
    FmsIODestroyFmsIOMetaDataInfo(dc_info->md);
    FREE(dc_info->md);
  }

  FREE(dc_info);

  return 0;
}